

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O1

void ArgmaxTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *location;
  typed_option<float> *ptVar2;
  option_group_definition *poVar3;
  uint uVar4;
  option_group_definition new_options;
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  string local_308;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  string local_2c8;
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  string local_288;
  option_group_definition local_268;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  undefined1 local_210 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  location = (float *)operator_new(0xc);
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"argmax options","");
  paVar1 = &local_268.m_name.field_2;
  local_268.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_230,local_230 + local_228);
  local_268.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"cost","");
  VW::config::typed_option<float>::typed_option(&local_d0,&local_2c8,location);
  ptVar2 = VW::config::typed_option<float>::default_value(&local_d0,10.0);
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"False Negative Cost","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (&local_268,ptVar2);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"negative_weight","");
  VW::config::typed_option<float>::typed_option(&local_170,&local_308,location + 1);
  ptVar2 = VW::config::typed_option<float>::default_value(&local_170,1.0);
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"Relative weight of negative examples","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar2)
  ;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"max","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_288,(bool *)(location + 2));
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a8,"Disable structure: just predict the max","");
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar3,(typed_option<bool> *)local_210);
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0]);
  }
  local_210._0_8_ = &PTR__typed_option_00306b28;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_00306540;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_00306540;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options);
  sch->task_data = location;
  uVar4 = 0;
  if (*(char *)(location + 2) == '\0') {
    uVar4 = Search::AUTO_CONDITION_FEATURES;
  }
  Search::search::set_options(sch,uVar4 | Search::EXAMPLES_DONT_CHANGE);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_268.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_268.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* D = new task_data();

  option_group_definition new_options("argmax options");
  new_options.add(make_option("cost", D->false_negative_cost).default_value(10.0f).help("False Negative Cost"))
      .add(make_option("negative_weight", D->negative_weight)
               .default_value(1.f)
               .help("Relative weight of negative examples"))
      .add(make_option("max", D->predict_max).help("Disable structure: just predict the max"));
  options.add_and_parse(new_options);

  sch.set_task_data(D);

  if (D->predict_max)
    sch.set_options(Search::EXAMPLES_DONT_CHANGE);  // we don't do any internal example munging
  else
    sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
        Search::EXAMPLES_DONT_CHANGE);                 // we don't do any internal example munging
}